

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network.cpp
# Opt level: O0

void __thiscall
polyscope::CurveNetwork::fillEdgeGeometryBuffers(CurveNetwork *this,ShaderProgram *program)

{
  long *plVar1;
  bool bVar2;
  long *in_RSI;
  CurveNetworkNodeScalarQuantity *nodeRadQ;
  char *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  undefined1 local_108 [23];
  allocator local_f1;
  string local_f0 [16];
  ManagedBuffer<unsigned_int> *in_stack_ffffffffffffff20;
  ManagedBuffer<float> *in_stack_ffffffffffffff28;
  undefined1 local_d0 [23];
  allocator local_b9;
  string local_b8 [32];
  CurveNetworkNodeScalarQuantity *local_98;
  undefined1 local_90 [23];
  allocator local_79;
  string local_78 [24];
  CurveNetwork *in_stack_ffffffffffffffa0;
  undefined1 local_58 [39];
  allocator local_31;
  string local_30 [32];
  long *local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"a_position_tail",&local_31);
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::getIndexedRenderAttributeBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff20);
  (**(code **)(*in_RSI + 0x98))(in_RSI,local_30,local_58);
  std::shared_ptr<polyscope::render::AttributeBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::AttributeBuffer> *)0x4ada43);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  plVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"a_position_tip",&local_79);
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::getIndexedRenderAttributeBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff20);
  (**(code **)(*plVar1 + 0x98))(plVar1,local_78,local_90);
  std::shared_ptr<polyscope::render::AttributeBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::AttributeBuffer> *)0x4adaec);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  bVar2 = std::operator!=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  if (bVar2) {
    local_98 = resolveNodeRadiusQuantity(in_stack_ffffffffffffffa0);
    plVar1 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"a_tailRadius",&local_b9);
    render::ManagedBuffer<float>::getIndexedRenderAttributeBuffer
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    (**(code **)(*plVar1 + 0x98))(plVar1,local_b8,local_d0);
    std::shared_ptr<polyscope::render::AttributeBuffer>::~shared_ptr
              ((shared_ptr<polyscope::render::AttributeBuffer> *)0x4adbcd);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"a_tipRadius",&local_f1);
    render::ManagedBuffer<float>::getIndexedRenderAttributeBuffer
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    (**(code **)(*local_10 + 0x98))(local_10,local_f0,local_108);
    std::shared_ptr<polyscope::render::AttributeBuffer>::~shared_ptr
              ((shared_ptr<polyscope::render::AttributeBuffer> *)0x4adc69);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  }
  return;
}

Assistant:

void CurveNetwork::fillEdgeGeometryBuffers(render::ShaderProgram& program) {
  program.setAttribute("a_position_tail", nodePositions.getIndexedRenderAttributeBuffer(edgeTailInds));
  program.setAttribute("a_position_tip", nodePositions.getIndexedRenderAttributeBuffer(edgeTipInds));

  if (nodeRadiusQuantityName != "") {
    CurveNetworkNodeScalarQuantity& nodeRadQ = resolveNodeRadiusQuantity();
    program.setAttribute("a_tailRadius", nodeRadQ.values.getIndexedRenderAttributeBuffer(edgeTailInds));
    program.setAttribute("a_tipRadius", nodeRadQ.values.getIndexedRenderAttributeBuffer(edgeTipInds));
  }
}